

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static-var-tests.cpp
# Opt level: O0

void StaticVarsDumpToFile(bool *result)

{
  int iVar1;
  uint uVar2;
  uint64_t local_20;
  uint64_t staticMemSize;
  size_t staticMemCount;
  bool *result_local;
  
  staticMemCount = (size_t)result;
  MemPlumber::staticMemCheck(&staticMemSize,&local_20,true,"staticvarsdump.log",false);
  iVar1 = countLinesInFile("staticvarsdump.log");
  if (iVar1 == 4) {
    MemPlumber::staticMemCheck(&staticMemSize,&local_20,true,"staticvarsdump.log",true);
    iVar1 = countLinesInFile("staticvarsdump.log");
    if (iVar1 == 8) {
      MemPlumber::staticMemCheck(&staticMemSize,&local_20,true,"staticvarsdump.log",false);
      iVar1 = countLinesInFile("staticvarsdump.log");
      if (iVar1 != 4) {
        uVar2 = countLinesInFile("staticvarsdump.log");
        printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
               "StaticVarsDumpToFile",0x5c,(ulong)uVar2,4);
        *(undefined1 *)staticMemCount = 0;
      }
    }
    else {
      uVar2 = countLinesInFile("staticvarsdump.log");
      printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
             "StaticVarsDumpToFile",0x58,(ulong)uVar2,8);
      *(undefined1 *)staticMemCount = 0;
    }
  }
  else {
    uVar2 = countLinesInFile("staticvarsdump.log");
    printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","StaticVarsDumpToFile"
           ,0x54,(ulong)uVar2,4);
    *(undefined1 *)staticMemCount = 0;
  }
  return;
}

Assistant:

TEST_CASE(StaticVarsDumpToFile) {

    size_t staticMemCount;
    uint64_t staticMemSize;
    MemPlumber::staticMemCheck(staticMemCount, staticMemSize, true, "staticvarsdump.log", false);

    TEST_ASSERT_EQUAL(countLinesInFile("staticvarsdump.log"), 4);

    MemPlumber::staticMemCheck(staticMemCount, staticMemSize, true, "staticvarsdump.log", true);

    TEST_ASSERT_EQUAL(countLinesInFile("staticvarsdump.log"), 8);

    MemPlumber::staticMemCheck(staticMemCount, staticMemSize, true, "staticvarsdump.log", false);

    TEST_ASSERT_EQUAL(countLinesInFile("staticvarsdump.log"), 4);
}